

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v6::detail::vformat<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char> format_str,
          basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          args)

{
  buffer<char> local_250;
  char local_230 [536];
  
  local_250.size_ = 0;
  local_250._vptr_buffer = (_func_int **)&PTR_grow_00116a58;
  local_250.capacity_ = 500;
  local_250.ptr_ = local_230;
  vformat_to<char>(&local_250,format_str,args);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_250.ptr_,local_250.ptr_ + local_250.size_);
  local_250._vptr_buffer = (_func_int **)&PTR_grow_00116a58;
  if (local_250.ptr_ != local_230) {
    operator_delete(local_250.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> detail::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}